

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::refill(Forth *this)

{
  ulong uVar1;
  bool bVar2;
  SCell SVar3;
  Cell CVar4;
  uint Source;
  size_type sVar5;
  uint address;
  Cell blk;
  SCell sourceid_;
  Forth *this_local;
  
  requireDStackAvailable(this,1,"REFILL");
  SVar3 = getSourceId(this);
  CVar4 = getDataCell(this,this->VarOffsetBlkAddress);
  if (CVar4 == 0) {
    if (SVar3 < 0) {
      push(this,this->False);
    }
    else {
      this->inputBufferStringsCurrent = this->inputBufferStringsCurrent + 1;
      uVar1 = this->inputBufferStringsCurrent;
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->inputBufferStrings);
      if (uVar1 < sVar5) {
        bVar2 = setSourceBuffer(this);
        if (bVar2) {
          push(this,this->True);
        }
        else {
          push(this,this->False);
        }
      }
      else {
        push(this,this->False);
      }
    }
  }
  else {
    ForthStack<unsigned_int>::push(&this->dStack,CVar4 + 1);
    block(this);
    Source = ForthStack<unsigned_int>::getTop(&this->dStack);
    pop(this);
    setSourceId(this,0);
    setDataCell(this,this->VarOffsetBlkAddress,CVar4 + 1);
    setSourceVariables(this,Source,0x400,0);
    push(this,this->True);
  }
  return;
}

Assistant:

void refill() { 
			REQUIRE_DSTACK_AVAILABLE(1, "REFILL");
			auto sourceid_ = getSourceId();
			auto blk=getDataCell(VarOffsetBlkAddress);
			if (blk > 0) {
				++blk;
				dStack.push(blk);
				block();
				auto address=dStack.getTop();pop();
				setSourceId(0);
				setDataCell(VarOffsetBlkAddress, Cell(blk)); // set BLK=u
				setSourceVariables(address, 1024, 0);
				push(True);
			}
			else {
				if (sourceid_ >= 0) { // if input from file or from input buffer
					inputBufferStringsCurrent++;
					if (inputBufferStringsCurrent < inputBufferStrings.size()) {
						if (setSourceBuffer()) {
							push(True);
						}
						else {
							push(False);
						}
					}
					else {
						push(False);
					}
				}
				else {
					push(False); // input from EVALUATE
				}
			}
		}